

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManUnCreateGroups(Mop_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vGroup;
  int nBefore;
  int iCube1;
  int c1;
  int i;
  Vec_Wec_t *vGroups_local;
  Mop_Man_t *p_local;
  
  iVar1 = Vec_IntSize(p->vCubes);
  Vec_IntClear(p->vCubes);
  for (iCube1 = 0; iVar2 = Vec_WecSize(vGroups), iCube1 < iVar2; iCube1 = iCube1 + 1) {
    p_00 = Vec_WecEntry(vGroups,iCube1);
    for (nBefore = 0; iVar2 = Vec_IntSize(p_00), nBefore < iVar2; nBefore = nBefore + 1) {
      iVar2 = Vec_IntEntry(p_00,nBefore);
      if (iVar2 != -1) {
        Vec_IntPush(p->vCubes,iVar2);
      }
    }
  }
  iVar2 = Vec_IntSize(p->vCubes);
  return iVar1 - iVar2;
}

Assistant:

static inline int Mop_ManUnCreateGroups( Mop_Man_t * p, Vec_Wec_t * vGroups )
{
    int i, c1, iCube1;
    int nBefore = Vec_IntSize(p->vCubes);
    Vec_Int_t * vGroup; 
    Vec_IntClear( p->vCubes );
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_IntForEachEntry( vGroup, iCube1, c1 )
            if ( iCube1 != -1 )
                Vec_IntPush( p->vCubes, iCube1 );
    return nBefore - Vec_IntSize(p->vCubes);
}